

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O1

void __thiscall
opengv::math::Sturm::findRoots2
          (Sturm *this,vector<double,_std::allocator<double>_> *roots,double eps_x,double eps_val)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  iterator iVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  Bracket *pBVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  size_t sVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  undefined8 *puVar15;
  long lVar16;
  _Self __tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar17 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar18 [16];
  double root;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  stack;
  MatrixXd monomials;
  MatrixXd matValue;
  MatrixXd matDerivative;
  assign_op<double,_double> local_131;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  double local_128;
  _List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  local_120;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  MatrixXd *local_f0;
  undefined1 local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  variable_if_dynamic<long,__1> local_d8;
  MatrixXd *local_d0;
  variable_if_dynamic<long,__1> local_c8;
  variable_if_dynamic<long,__1> vStack_c0;
  Index local_b8;
  DenseStorage<double,__1,__1,__1,_0> *local_b0;
  undefined1 local_a8 [16];
  DenseStorage<double,__1,__1,__1,_0> local_98;
  vector<double,std::allocator<double>> *local_80;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_60 = eps_val;
  local_58 = eps_x;
  local_a8._0_8_ = computeLagrangianBound(this);
  local_a8._8_8_ = extraout_XMM0_Qb;
  local_120._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_120;
  local_120._M_impl._M_node._M_size = 0;
  local_120._M_impl._M_node.super__List_node_base._M_prev =
       local_120._M_impl._M_node.super__List_node_base._M_next;
  pBVar9 = (Bracket *)operator_new(0x30);
  auVar17._8_8_ = 0x8000000000000000;
  auVar17._0_8_ = 0x8000000000000000;
  auVar17 = vxorpd_avx512vl(local_a8,auVar17);
  Bracket::Bracket(pBVar9,auVar17._0_8_,local_a8._0_8_);
  local_e8 = (undefined1  [8])pBVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<opengv::math::Bracket*>
            (&_Stack_e0,pBVar9);
  p_Var10 = (_List_node_base *)operator_new(0x20);
  _Var7._M_pi = _Stack_e0._M_pi;
  p_Var10[1]._M_prev = (_List_node_base *)0x0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var10[1]._M_next = (_List_node_base *)local_e8;
  p_Var10[1]._M_prev = (_List_node_base *)_Var7._M_pi;
  local_e8 = (undefined1  [8])0x0;
  std::__detail::_List_node_base::_M_hook(p_Var10);
  local_120._M_impl._M_node._M_size = local_120._M_impl._M_node._M_size + 1;
  if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
  }
  p_Var10 = local_120._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var11 = (_List_node_base *)evaluateChain2(this,(double)p_Var10->_M_prev);
  p_Var10[2]._M_next = p_Var11;
  *(undefined1 *)&p_Var10[1]._M_prev = 1;
  p_Var10 = local_120._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var11 = (_List_node_base *)evaluateChain2(this,(double)p_Var10[1]._M_next);
  p_Var10[2]._M_prev = p_Var11;
  *(undefined1 *)((long)&p_Var10[1]._M_prev + 1) = 1;
  sVar12 = Bracket::numberRoots
                     ((Bracket *)local_120._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)
  ;
  std::vector<double,_std::allocator<double>_>::reserve(roots,sVar12);
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  local_108.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,this->_dimension,this->_dimension,1)
  ;
  local_108.m_data[this->_dimension - 1] = 1.0;
  if (local_120._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_120) {
    local_f0 = &this->_C;
    local_48 = 0x7fffffffffffffff;
    uStack_40 = 0x7fffffffffffffff;
    local_80 = (vector<double,std::allocator<double>> *)roots;
    do {
      pBVar9 = (Bracket *)local_120._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_120._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      std::__cxx11::
      list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
      ::_M_erase((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                  *)&local_120,(iterator)local_120._M_impl._M_node.super__List_node_base._M_next);
      bVar8 = Bracket::dividable(pBVar9,local_58);
      if (bVar8) {
        sVar12 = Bracket::numberRoots(pBVar9);
        local_130 = this_00;
        if (sVar12 == 1) {
          local_128 = (pBVar9->_lowerBound + pBVar9->_upperBound) * 0.5;
          uVar3 = this->_dimension;
          if (1 < uVar3) {
            uVar13 = uVar3 + 1;
            if (uVar13 < 4) {
              uVar13 = 3;
            }
            dVar1 = local_108.m_data[uVar3 - 1];
            lVar16 = -2;
            do {
              dVar1 = dVar1 * local_128;
              local_108.m_data[uVar3 + lVar16] = dVar1;
              lVar16 = lVar16 + -1;
            } while (-lVar16 != uVar13);
          }
          local_e8 = (undefined1  [8])
                     (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
          local_d8.m_value =
               (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols;
          local_d0 = local_f0;
          local_c8.m_value = 0;
          vStack_c0.m_value = 0;
          local_b8 = 1;
          local_b0 = &local_108;
          local_98.m_data = (double *)0x0;
          local_98.m_rows = 0;
          local_98.m_cols = 0;
          if ((local_108.m_cols != 0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_108.m_cols),
                     0) < 1)) {
            puVar15 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar15 = operator_delete;
            __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                    (&local_98,local_108.m_cols,1,local_108.m_cols);
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_98,(SrcXprType *)local_e8,
                (assign_op<double,_double> *)&local_78);
          local_a8._8_8_ = 0;
          local_a8._0_8_ = *local_98.m_data;
          bVar8 = false;
          do {
            if (bVar8) break;
            local_d8.m_value =
                 (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_cols;
            local_e8 = (undefined1  [8])
                       ((this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data + 1);
            local_d0 = local_f0;
            local_c8.m_value = 1;
            vStack_c0.m_value = 0;
            local_b8 = 1;
            local_b0 = &local_108;
            local_78.m_data = (double *)0x0;
            local_78.m_rows = 0;
            local_78.m_cols = 0;
            if ((local_108.m_cols != 0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
                       SEXT816(local_108.m_cols),0) < 1)) {
              puVar15 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar15 = operator_delete;
              __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                      (&local_78,local_108.m_cols,1,local_108.m_cols);
            Eigen::internal::
            Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
            ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_78,(SrcXprType *)local_e8,&local_131);
            dVar1 = local_128 - (double)local_a8._0_8_ / *local_78.m_data;
            if ((dVar1 < pBVar9->_lowerBound) || (pBVar9->_upperBound < dVar1)) {
LAB_0025edd8:
              bVar6 = false;
            }
            else {
              uVar3 = this->_dimension;
              if (1 < uVar3) {
                uVar13 = uVar3 + 1;
                if (uVar13 < 4) {
                  uVar13 = 3;
                }
                dVar2 = local_108.m_data[uVar3 - 1];
                lVar16 = -2;
                do {
                  dVar2 = dVar1 * dVar2;
                  local_108.m_data[uVar3 + lVar16] = dVar2;
                  lVar16 = lVar16 + -1;
                } while (-lVar16 != uVar13);
              }
              local_e8 = (undefined1  [8])
                         (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_storage.m_data;
              local_d8.m_value =
                   (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
              local_d0 = local_f0;
              local_c8.m_value = 0;
              vStack_c0.m_value = 0;
              local_b8 = 1;
              local_b0 = &local_108;
              local_50 = dVar1;
              Eigen::internal::
              call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)&local_98,
                         (Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                          *)local_e8,&local_131,(type)0x0);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = *local_98.m_data;
              auVar5._8_8_ = uStack_40;
              auVar5._0_8_ = local_48;
              auVar17 = vandpd_avx(auVar18,auVar5);
              auVar5 = vandpd_avx(auVar5,local_a8);
              if (auVar5._0_8_ < auVar17._0_8_) goto LAB_0025edd8;
              local_128 = local_50;
              if (auVar17._0_8_ < local_60) {
                bVar8 = true;
              }
              bVar6 = true;
              local_a8 = auVar18;
            }
            if (local_78.m_data != (double *)0x0) {
              free((void *)local_78.m_data[-1]);
            }
            this_00 = local_130;
          } while (bVar6);
          if (bVar8) {
            iVar4._M_current = *(double **)(local_80 + 8);
            if (iVar4._M_current == *(double **)(local_80 + 0x10)) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_80,iVar4,&local_128);
            }
            else {
              *iVar4._M_current = local_128;
              *(double **)(local_80 + 8) = iVar4._M_current + 1;
            }
          }
          if (local_98.m_data != (double *)0x0) {
            free((void *)local_98.m_data[-1]);
          }
          roots = (vector<double,_std::allocator<double>_> *)local_80;
          if (bVar8) goto LAB_0025ef2c;
        }
        Bracket::divide(pBVar9,(list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                                *)&local_120);
        p_Var11 = local_120._M_impl._M_node.super__List_node_base._M_prev;
        p_Var14 = (_List_node_base *)
                  evaluateChain2(this,(double)(local_120._M_impl._M_node.super__List_node_base.
                                               _M_prev[1]._M_next)->_M_prev);
        p_Var10 = p_Var11[1]._M_next;
        p_Var10[2]._M_next = p_Var14;
        *(undefined1 *)&p_Var10[1]._M_prev = 1;
        p_Var10 = p_Var11->_M_prev[1]._M_next;
        p_Var10[2]._M_prev = p_Var14;
        *(undefined1 *)((long)&p_Var10[1]._M_prev + 1) = 1;
        this_00 = local_130;
      }
      else {
        sVar12 = Bracket::numberRoots(pBVar9);
        if (sVar12 != 0) {
          local_e8 = (undefined1  [8])((pBVar9->_lowerBound + pBVar9->_upperBound) * 0.5);
          iVar4._M_current = *(double **)((long)roots + 8);
          if (iVar4._M_current == *(double **)((long)roots + 0x10)) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (roots,iVar4,(double *)local_e8);
          }
          else {
            *iVar4._M_current = (double)local_e8;
            *(double **)((long)roots + 8) = iVar4._M_current + 1;
          }
        }
      }
LAB_0025ef2c:
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    } while (local_120._M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&local_120);
  }
  if (local_108.m_data != (double *)0x0) {
    free((void *)local_108.m_data[-1]);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::_M_clear(&local_120);
  return;
}

Assistant:

void
opengv::math::Sturm::findRoots2( std::vector<double> & roots, double eps_x, double eps_val )
{
  double absoluteBound = computeLagrangianBound();
  std::list<Bracket::Ptr> stack;
  stack.push_back(Bracket::Ptr(new Bracket(-absoluteBound,absoluteBound)));
  stack.back()->setLowerBoundChanges( evaluateChain2(stack.back()->lowerBound()) );
  stack.back()->setUpperBoundChanges( evaluateChain2(stack.back()->upperBound()) );
  roots.reserve(stack.back()->numberRoots());
  
  //some variables for pollishing
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;
  
  while( !stack.empty() )
  {  
    Bracket::Ptr bracket = stack.front();
    stack.pop_front();
    
    if( bracket->dividable(eps_x) )
    {
      bool divide = true;
      
      if( bracket->numberRoots() == 1 )
      {
        //new part, we try immediately to do the pollishing here
        bool converged = false;
        
        double root = 0.5 * (bracket->lowerBound() + bracket->upperBound());
        for(size_t i = 2; i <= _dimension; i++)
          monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*root;
        Eigen::MatrixXd matValue = _C.row(0) * monomials;
        
        double value = matValue(0,0);
        
        while( !converged )
        {
          Eigen::MatrixXd matDerivative = _C.row(1) * monomials;
          double derivative = matDerivative(0,0);
          
          double newRoot = root - (value/derivative);
          
          if( newRoot < bracket->lowerBound() || newRoot > bracket->upperBound() )
            break;
          
          for(size_t i = 2; i <= _dimension; i++)
            monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*newRoot;
          matValue = _C.row(0) * monomials;
          
          double newValue = matValue(0,0);
          
          if( fabs(newValue) > fabs(value) )
            break;
          
          //do update
          value = newValue;
          root = newRoot;
          
          //check if converged
          if( fabs(value) < eps_val )
            converged = true;
        }
        
        if( converged )
        {
          divide = false;
          roots.push_back(root);
        }
      }
      
      if(divide)
      {
        bracket->divide(stack);
        std::list<Bracket::Ptr>::iterator it = stack.end();
        it--;
        size_t changes = evaluateChain2((*it)->lowerBound());
        (*it)->setLowerBoundChanges(changes);
        it--;
        (*it)->setUpperBoundChanges(changes);
      }
    }
    else
    {
      if( bracket->numberRoots() > 0 )
        roots.push_back(0.5 * (bracket->lowerBound() + bracket->upperBound()));
    }
  }
}